

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitors.c
# Opt level: O1

char * format_mode(GLFWvidmode *mode)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = sprintf(format_mode::buffer,"%i x %i x %i (%i %i %i) %i Hz",(ulong)(uint)mode->width,
                  (ulong)(uint)mode->height,
                  (ulong)(uint)(mode->greenBits + mode->redBits + mode->blueBits),
                  (ulong)(uint)mode->redBits,(ulong)(uint)mode->greenBits,
                  (ulong)(uint)mode->blueBits,(ulong)(uint)mode->refreshRate);
  format_mode::buffer[0x1ff] = '\0';
  return (char *)CONCAT44(extraout_var,iVar1);
}

Assistant:

static const char* format_mode(const GLFWvidmode* mode)
{
    static char buffer[512];

    sprintf(buffer,
            "%i x %i x %i (%i %i %i) %i Hz",
            mode->width, mode->height,
            mode->redBits + mode->greenBits + mode->blueBits,
            mode->redBits, mode->greenBits, mode->blueBits,
            mode->refreshRate);

    buffer[sizeof(buffer) - 1] = '\0';
    return buffer;
}